

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misctests.c
# Opt level: O0

void supersmoothertest(void)

{
  double *x_00;
  int local_4b0;
  int N;
  int i;
  int periodic;
  double alpha;
  double span;
  double y [144];
  double *oup;
  double *x;
  
  memcpy(&span,&DAT_0017f400,0x480);
  x_00 = (double *)malloc(0x480);
  y[0x8f] = (double)malloc(0x480);
  for (local_4b0 = 0; local_4b0 < 0x90; local_4b0 = local_4b0 + 1) {
    x_00[local_4b0] = (double)local_4b0;
  }
  supsmu(x_00,0x90,&span,(double *)0x0,1,0.0,-1.0,(double *)y[0x8f]);
  mdisplay((double *)y[0x8f],1,0x90);
  free(x_00);
  free((void *)y[0x8f]);
  return;
}

Assistant:

void supersmoothertest() {
	double *x, *oup;
	double y[144] = {112, 118, 132, 129, 121, 135, 148, 148, 136, 119, 104, 118,
        115, 126, 141, 135, 125, 149, 170, 170, 158, 133, 114, 140,
        145, 150, 178, 163, 172, 178, 199, 199, 184, 162, 146, 166,
        171, 180, 193, 181, 183, 218, 230, 242, 209, 191, 172, 194,
        196, 196, 236, 235, 229, 243, 264, 272, 237, 211, 180, 201,
        204, 188, 235, 227, 234, 264, 302, 293, 259, 229, 203, 229,
        242, 233, 267, 269, 270, 315, 364, 347, 312, 274, 237, 278,
        284, 277, 317, 313, 318, 374, 413, 405, 355, 306, 271, 306,
        315, 301, 356, 348, 355, 422, 465, 467, 404, 347, 305, 336,
        340, 318, 362, 348, 363, 435, 491, 505, 404, 359, 310, 337,
        360, 342, 406, 396, 420, 472, 548, 559, 463, 407, 362, 405,
        417, 391, 419, 461, 472, 535, 622, 606, 508, 461, 390, 432
	};
	double span,alpha;
	int periodic,i;

	int N = 144;

	x = (double*) malloc(sizeof(double)*N);
	oup = (double*) malloc(sizeof(double)*N);

	for(i = 0; i < N;++i) {
		x[i] = i;
	}

	periodic = 1;
	span = 0.0;
	alpha = -1.0;

	supsmu(x,N,y,NULL,periodic,span,alpha,oup);

	mdisplay(oup,1,N);

	free(x);
	free(oup);
}